

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

char * __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::SnailAllocPages<false>
          (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           *this,uint pageCount,PageSegmentBase<Memory::VirtualAllocWrapper> **pageSegment)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 *puVar5;
  PageSegmentBase<Memory::VirtualAllocWrapper> *this_00;
  DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *pDVar6;
  char *pcVar7;
  uintptr_t mask;
  ulong uVar8;
  Iterator local_60;
  ulong local_50;
  PageSegmentBase<Memory::VirtualAllocWrapper> **local_48;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *local_40;
  uint local_34;
  
  iVar3 = (*this->_vptr_PageAllocatorBase[3])();
  if ((char)iVar3 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x577,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar2) goto LAB_006781f4;
    *puVar5 = 0;
  }
  pDVar6 = (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)&this->emptySegments;
  local_50 = (ulong)pageCount;
  local_40 = (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)pDVar6;
  if ((DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
      (this->emptySegments).
      super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>.next.base == pDVar6
     ) {
LAB_00678088:
    pcVar7 = TryAllocDecommittedPages<false>(this,pageCount,pageSegment);
    if (pcVar7 != (char *)0x0) {
      FillAllocPages(this,pcVar7,pageCount);
      return pcVar7;
    }
    uVar4 = this->maxAllocPageCount;
    if (uVar4 < pageCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x5a9,"(maxAllocPageCount >= pageCount)","maxAllocPageCount >= pageCount")
      ;
      if (!bVar2) {
LAB_006781f4:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
      uVar4 = this->maxAllocPageCount;
    }
    if ((uVar4 - pageCount != 0) &&
       ((ulong)this->maxFreePageCount < (ulong)(uVar4 - pageCount) + this->freePageCount)) {
      this_00 = AllocPageSegment(&this->decommitSegments,this,false,false,this->enableWriteBarrier);
      if (this_00 == (PageSegmentBase<Memory::VirtualAllocWrapper> *)0x0) {
        return (char *)0x0;
      }
      pcVar7 = PageSegmentBase<Memory::VirtualAllocWrapper>::DoAllocDecommitPages<false>
                         (this_00,pageCount);
      if (pcVar7 == (char *)0x0) {
        return (char *)0x0;
      }
      this->decommitPageCount = this->decommitPageCount + (ulong)this_00->decommitPageCount;
      FillAllocPages(this,pcVar7,pageCount);
      uVar8 = local_50;
      LogRecommitPages(this,local_50);
      LogAllocPages(this,uVar8);
      goto LAB_006781da;
    }
    this_00 = AddPageSegment(this,local_40);
    if (this_00 == (PageSegmentBase<Memory::VirtualAllocWrapper> *)0x0) {
      return (char *)0x0;
    }
    pcVar7 = PageSegmentBase<Memory::VirtualAllocWrapper>::AllocPages<false>(this_00,pageCount);
    if (pcVar7 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  else {
    local_34 = pageCount;
    this_00 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Head
                        ((DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>
                          *)pDVar6);
    uVar8 = local_50 * 0x1000 - 1;
    if (((ulong)(this_00->super_SegmentBase<Memory::VirtualAllocWrapper>).address & uVar8) != 0) {
      local_60.list =
           (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)pDVar6;
      local_60.current = (NodeBase *)pDVar6;
      local_48 = pageSegment;
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      do {
        if (pDVar6 == (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                             ,0x66,"(current != nullptr)","current != nullptr");
          if (!bVar2) goto LAB_006781f4;
          *puVar5 = 0;
          pDVar6 = (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
                   local_60.current;
        }
        pDVar6 = (pDVar6->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                 ).next.node;
        pageSegment = local_48;
        pageCount = local_34;
        if (pDVar6 == (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
                      local_60.list) goto LAB_00678088;
        local_60.current =
             &pDVar6->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>;
        this_00 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::
                  Iterator::Data(&local_60);
        pDVar6 = (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
                 local_60.current;
      } while (((ulong)(this_00->super_SegmentBase<Memory::VirtualAllocWrapper>).address & uVar8) !=
               0);
      DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::EditingIterator::
      MoveCurrentTo((EditingIterator *)&local_60,local_40);
      pageSegment = local_48;
    }
    pageCount = local_34;
    pcVar7 = PageSegmentBase<Memory::VirtualAllocWrapper>::AllocPages<false>(this_00,local_34);
    if (pcVar7 == (char *)0x0) goto LAB_00678088;
  }
  OnAllocFromNewSegment
            (this,pageCount,pcVar7,&this_00->super_SegmentBase<Memory::VirtualAllocWrapper>);
LAB_006781da:
  *pageSegment = this_00;
  return pcVar7;
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::SnailAllocPages(uint pageCount, TPageSegment ** pageSegment)
{
    Assert(!this->HasMultiThreadAccess());

    char * pages = nullptr;
    TPageSegment * newSegment = nullptr;

    if (!emptySegments.Empty())
    {
        newSegment = &emptySegments.Head();

        if (!notPageAligned && !TPageSegment::IsAllocationPageAligned(newSegment->GetAddress(), pageCount))
        {
            newSegment = nullptr;

            // Scan through the empty segments for a segment that can fit this allocation
            FOREACH_DLISTBASE_ENTRY_EDITING(TPageSegment, emptySegment, &this->emptySegments, iter)
            {
                if (TPageSegment::IsAllocationPageAligned(emptySegment.GetAddress(), pageCount))
                {
                    iter.MoveCurrentTo(&this->emptySegments);
                    newSegment = &emptySegment;
                    break;
                }
            }
            NEXT_DLISTBASE_ENTRY_EDITING
        }

        if (newSegment != nullptr)
        {
            pages = newSegment->template AllocPages<notPageAligned>(pageCount);
            if (pages != nullptr)
            {
                OnAllocFromNewSegment(pageCount, pages, newSegment);
                *pageSegment = newSegment;
                return pages;
            }
        }
    }

    pages = TryAllocDecommittedPages<notPageAligned>(pageCount, pageSegment);
    if (pages != nullptr)
    {
        // TryAllocDecommittedPages may give out a mix of free pages and decommitted pages.
        // Free pages are filled with 0xFE in debug build, so we need to zero them
        // out before giving it out. In release build, free page is already zeroed
        // in ReleasePages
        this->FillAllocPages(pages, pageCount);
        return pages;
    }

    Assert(pages == nullptr);
    Assert(maxAllocPageCount >= pageCount);
    if (maxAllocPageCount != pageCount && (maxFreePageCount < maxAllocPageCount - pageCount + freePageCount))
    {
        // If we exceed the number of max free page count, allocate from a new fully decommit block
        TPageSegment * decommitSegment = AllocPageSegment(
            this->decommitSegments, this, false, false, this->enableWriteBarrier);
        if (decommitSegment == nullptr)
        {
            return nullptr;
        }

        pages = decommitSegment->template DoAllocDecommitPages<notPageAligned>(pageCount);
        if (pages != nullptr)
        {
#if DBG_DUMP
            this->decommitPageCount = this->decommitPageCount + decommitSegment->GetDecommitPageCount();
#endif
            this->FillAllocPages(pages, pageCount);

            LogRecommitPages(pageCount);
            LogAllocPages(pageCount);

            *pageSegment = decommitSegment;
        }
        return pages;
    }

    // At this point, we haven't been able to allocate either from the
    // decommitted pages, or from the empty segment list, so we'll
    // try allocating a segment. In a page allocator with a pre-reserved segment,
    // we're not allowed to allocate additional segments so return here.
    // Otherwise, add a new segment and allocate from it

    newSegment = AddPageSegment(emptySegments);
    if (newSegment == nullptr)
    {
        return nullptr;
    }

    pages = newSegment->template AllocPages<notPageAligned>(pageCount);
    if (notPageAligned)
    {
        // REVIEW: Is this true for single-chunk allocations too? Are new segments guaranteed to
        // allow for single-chunk allocations to succeed?
        Assert(pages != nullptr);
    }

    if (pages != nullptr)
    {
        OnAllocFromNewSegment(pageCount, pages, newSegment);
        *pageSegment = newSegment;
    }

    return pages;
}